

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VConstVectorArray_Serial(int nvec,realtype c,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  realtype *zd;
  sunindextype N;
  sunindextype j;
  int i;
  N_Vector *Z_local;
  realtype c_local;
  int nvec_local;
  
  if (nvec < 1) {
    c_local._4_4_ = -1;
  }
  else if (nvec == 1) {
    N_VConst_Serial(c,*Z);
    c_local._4_4_ = 0;
  }
  else {
    lVar1 = *(*Z)->content;
    for (j._4_4_ = 0; j._4_4_ < nvec; j._4_4_ = j._4_4_ + 1) {
      lVar2 = *(long *)((long)Z[j._4_4_]->content + 0x10);
      for (N = 0; N < lVar1; N = N + 1) {
        *(realtype *)(lVar2 + N * 8) = c;
      }
    }
    c_local._4_4_ = 0;
  }
  return c_local._4_4_;
}

Assistant:

int N_VConstVectorArray_Serial(int nvec, realtype c, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VConst */
  if (nvec == 1) {
    N_VConst_Serial(c, Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* set each vector in the vector array to a constant */
  for (i=0; i<nvec; i++) {
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c;
    }
  }

  return(0);
}